

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O3

void step_to_eos(lgx_lex_t *ctx,char end)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  iVar2 = (ctx->source).length;
  iVar4 = ctx->offset;
  if (iVar4 < iVar2) {
    pcVar3 = (ctx->source).content;
    do {
      cVar1 = pcVar3[iVar4];
      if (cVar1 == '\\') {
        iVar4 = iVar4 + 1;
      }
      else if (cVar1 == end && iVar4 < iVar2) {
        ctx->offset = iVar4 + 1;
        return;
      }
      iVar4 = iVar4 + 1;
      ctx->offset = iVar4;
    } while (iVar4 < iVar2);
  }
  return;
}

Assistant:

static void step_to_eos(lgx_lex_t* ctx, char end) {
    while (ctx->offset < ctx->source.length) {
        // 处理转义字符 \r \n \t \\ \" \' \0 \xFF
        if (is_next(ctx, '\\')) {
            // 这里只要确保读到正确的字符串结尾，不需要判断转义字符是否合法
            ctx->offset++;
        } else if (is_next(ctx, end)) {
            break;
        } else {
            ctx->offset++;
        }
    }
}